

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayStrideGroup::init
          (SingleVertexArrayStrideGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  Storage extraout_EDX;
  Storage extraout_EDX_00;
  Storage SVar2;
  bool bVar3;
  GLValue GVar4;
  GLValue GVar5;
  bool local_249;
  int local_248;
  int local_244;
  int local_240;
  undefined1 local_230 [8];
  Spec spec;
  undefined4 uStack_1f4;
  undefined1 local_1e8 [8];
  ArraySpec arraySpec;
  string local_1a0;
  string local_180;
  string local_160;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string name;
  bool bufferUnaligned;
  int alignment;
  int stride;
  int iStack_38;
  bool packed;
  int strideNdx;
  int countNdx;
  int componentCount;
  int storageNdx;
  int strides [3];
  int counts [2];
  Storage storages [2];
  SingleVertexArrayStrideGroup *this_local;
  
  counts[0] = 0;
  counts[1] = 1;
  strides[1] = 1;
  strides[2] = 0x100;
  _componentCount = 0x11ffffffff;
  iVar1 = 0x20;
  strides[0] = 0x20;
  countNdx = 0;
  while (countNdx < 2) {
    for (strideNdx = 2; strideNdx < 5; strideNdx = strideNdx + 1) {
      for (iStack_38 = 0; iStack_38 < 2; iStack_38 = iStack_38 + 1) {
        for (stride = 0; stride < 3; stride = stride + 1) {
          bVar3 = true;
          if (this->m_type != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            bVar3 = this->m_type == INPUTTYPE_INT_2_10_10_10;
          }
          if ((&componentCount)[stride] < 0) {
            if (bVar3) {
              local_240 = 0x10;
            }
            else {
              local_240 = deqp::gls::Array::inputTypeSize(this->m_type);
              local_240 = local_240 * strideNdx;
            }
            local_244 = local_240;
          }
          else {
            local_244 = (&componentCount)[stride];
          }
          if (bVar3) {
            local_248 = deqp::gls::Array::inputTypeSize(this->m_type);
            local_248 = local_248 * strideNdx;
            SVar2 = extraout_EDX;
          }
          else {
            local_248 = deqp::gls::Array::inputTypeSize(this->m_type);
            SVar2 = extraout_EDX_00;
          }
          local_249 = false;
          if (counts[countNdx] == 1) {
            SVar2 = local_244 % local_248;
            local_249 = SVar2 != STORAGE_USER;
          }
          name.field_2._M_local_buf[0xf] = local_249;
          deqp::gls::Array::storageToString_abi_cxx11_
                    (&local_130,(Array *)(ulong)(uint)counts[countNdx],SVar2);
          std::operator+(&local_110,&local_130,"_stride");
          typeToString<int>(&local_160,local_244);
          std::operator+(&local_f0,&local_110,&local_160);
          std::operator+(&local_d0,&local_f0,"_components");
          typeToString<int>(&local_180,strideNdx);
          std::operator+(&local_b0,&local_d0,&local_180);
          std::operator+(&local_90,&local_b0,"_quads");
          typeToString<int>(&local_1a0,strides[(long)iStack_38 + 1]);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,&local_90,&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          if (((this->m_type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) ||
              (this->m_type == INPUTTYPE_INT_2_10_10_10)) && (strideNdx != 4)) {
            arraySpec.max.field_1._4_4_ = 0xd;
          }
          else {
            type = this->m_type;
            SVar2 = counts[countNdx];
            GVar4 = deqp::gls::GLValue::getMinValue(type);
            GVar5 = deqp::gls::GLValue::getMaxValue(this->m_type);
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar5.type;
            max_._4_4_ = spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            max_.type = (InputType)
                        spec.arrays.
                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            min_._4_4_ = uStack_1f4;
            min_.type = GVar4.type;
            min_.field_1 = GVar4.field_1;
            max_.field_1 = GVar5.field_1;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      ((ArraySpec *)local_1e8,type,OUTPUTTYPE_VEC4,SVar2,USAGE_DYNAMIC_DRAW,
                       strideNdx,0,local_244,false,min_,max_);
            deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_230);
            local_230._0_4_ = PRIMITIVE_TRIANGLES;
            local_230._4_4_ = strides[(long)iStack_38 + 1];
            spec.primitive = PRIMITIVE_POINTS;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         *)&spec.first,(value_type *)local_1e8);
            if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
              name_00 = (char *)std::__cxx11::string::c_str();
              desc = (char *)std::__cxx11::string::c_str();
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,testCtx,renderCtx,(Spec *)local_230,name_00,desc);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            }
            deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_230);
            arraySpec.max.field_1._4_4_ = 0;
          }
          std::__cxx11::string::~string((string *)local_70);
        }
      }
    }
    iVar1 = countNdx + 1;
    countNdx = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayStrideGroup::init (void)
{
	Array::Storage		storages[]		= {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	int					counts[]		= {1, 256};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		for (int componentCount = 2; componentCount < 5; componentCount++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (16) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	bufferUnaligned	= (storages[storageNdx] == Array::STORAGE_BUFFER) && (stride % alignment) != 0;

					std::string name = Array::storageToString(storages[storageNdx]) + "_stride" + typeToString(stride) + "_components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					if (!bufferUnaligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}